

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O0

void __thiscall
psy::C::Parser::DiagnosticsReporter::ExpectedFIRSTofEnumerationConstant(DiagnosticsReporter *this)

{
  allocator<char> local_31;
  string local_30;
  DiagnosticsReporter *local_10;
  DiagnosticsReporter *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"enumeration-constant",&local_31);
  ExpectedFIRSTof(this,&local_30,&ID_of_ExpectedFIRSTofEnumerationConstant_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void Parser::DiagnosticsReporter::ExpectedFIRSTofEnumerationConstant()
{
    return ExpectedFIRSTof("enumeration-constant", ID_of_ExpectedFIRSTofEnumerationConstant);
}